

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>::
         convert_abi_cxx11_(wstring_view str)

{
  string *in_RDI;
  wstring *in_stack_00000008;
  allocator<wchar_t> local_39;
  wstring local_38 [8];
  allocator<wchar_t> *in_stack_ffffffffffffffd0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_stack_ffffffffffffffd8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffffe0;
  
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  ::convert(in_stack_00000008);
  std::__cxx11::wstring::~wstring(local_38);
  std::allocator<wchar_t>::~allocator(&local_39);
  return in_RDI;
}

Assistant:

std::string StringMaker<std::wstring_view>::convert(std::wstring_view str) {
    return StringMaker<std::wstring>::convert(std::wstring(str));
}